

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

Float __thiscall pbrt::Triangle::Area(Triangle *this)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar13;
  float fVar14;
  undefined1 auVar11 [16];
  float fVar15;
  undefined1 auVar12 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  lVar2 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar3 = (long)this->triIndex;
  lVar4 = *(long *)(lVar2 + 8);
  lVar5 = (long)*(int *)(lVar4 + lVar3 * 0xc);
  lVar6 = (long)*(int *)(lVar4 + 4 + lVar3 * 0xc);
  lVar2 = *(long *)(lVar2 + 0x10);
  lVar4 = (long)*(int *)(lVar4 + 8 + lVar3 * 0xc);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(lVar2 + lVar6 * 0xc);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(lVar2 + 4 + lVar4 * 0xc);
  uVar1 = *(ulong *)(lVar2 + lVar5 * 0xc);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar1;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(lVar2 + 4 + lVar5 * 0xc);
  auVar12 = vsubps_avx(auVar17,auVar7);
  auVar17 = vsubps_avx(auVar16,auVar8);
  auVar16 = vmovshdup_avx(auVar12);
  auVar8 = ZEXT416((uint)(*(float *)(lVar2 + lVar4 * 0xc) - (float)uVar1));
  auVar7 = vpermi2ps_avx512vl(SUB6416(ZEXT464(4),0),auVar12,auVar8);
  auVar11 = ZEXT416((uint)(*(float *)(lVar2 + 8 + lVar6 * 0xc) - *(float *)(lVar2 + 8 + lVar5 * 0xc)
                          ));
  auVar18 = ZEXT416((uint)(auVar17._0_4_ * auVar16._0_4_));
  auVar8 = vfmsub213ss_fma(auVar8,auVar11,auVar18);
  auVar16 = vfnmadd213ss_fma(auVar16,auVar17,auVar18);
  fVar10 = auVar8._0_4_ + auVar16._0_4_;
  auVar8 = vpermi2ps_avx512vl(_DAT_00457a60,auVar17,auVar11);
  auVar11._0_4_ = auVar8._0_4_ * auVar7._0_4_;
  auVar11._4_4_ = auVar8._4_4_ * auVar7._4_4_;
  auVar11._8_4_ = auVar8._8_4_ * auVar7._8_4_;
  auVar11._12_4_ = auVar8._12_4_ * auVar7._12_4_;
  auVar16 = vfmsub213ps_fma(auVar12,auVar17,auVar11);
  auVar12 = vfnmadd213ps_fma(auVar7,auVar8,auVar11);
  fVar9 = auVar16._0_4_ + auVar12._0_4_;
  fVar13 = auVar16._4_4_ + auVar12._4_4_;
  fVar14 = auVar16._8_4_ + auVar12._8_4_;
  fVar15 = auVar16._12_4_ + auVar12._12_4_;
  auVar12._0_4_ = fVar9 * fVar9;
  auVar12._4_4_ = fVar13 * fVar13;
  auVar12._8_4_ = fVar14 * fVar14;
  auVar12._12_4_ = fVar15 * fVar15;
  auVar16 = vmovshdup_avx(auVar12);
  fVar10 = auVar12._0_4_ + auVar16._0_4_ + fVar10 * fVar10;
  if (fVar10 < 0.0) {
    fVar10 = sqrtf(fVar10);
  }
  else {
    auVar16 = vsqrtss_avx(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10));
    fVar10 = auVar16._0_4_;
  }
  return fVar10 * 0.5;
}

Assistant:

PBRT_CPU_GPU
    Float Area() const {
        // Get triangle vertices in _p0_, _p1_, and _p2_
        const TriangleMesh *mesh = GetMesh();
        const int *v = &mesh->vertexIndices[3 * triIndex];
        Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

        return 0.5f * Length(Cross(p1 - p0, p2 - p0));
    }